

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void write_to_buffer(DESCRIPTOR_DATA *d,char *txt,int length)

{
  string_view fmt;
  size_t sVar1;
  int in_EDX;
  CLogger *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  char *outbuf;
  DESCRIPTOR_DATA *in_stack_00001260;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  int local_14;
  
  local_14 = in_EDX;
  if (in_EDX < 1) {
    sVar1 = strlen((char *)in_RSI);
    local_14 = (int)sVar1;
  }
  if ((*(int *)(in_RDI + 0x6c4c) == 0) && ((*(byte *)(in_RDI + 0x34) & 1) == 0)) {
    **(undefined1 **)(in_RDI + 0x6c40) = 10;
    *(undefined1 *)(*(long *)(in_RDI + 0x6c40) + 1) = 0xd;
    *(undefined4 *)(in_RDI + 0x6c4c) = 2;
  }
  while( true ) {
    if (*(int *)(in_RDI + 0x6c4c) + local_14 < *(int *)(in_RDI + 0x6c48)) {
      strcpy((char *)(*(long *)(in_RDI + 0x6c40) + (long)*(int *)(in_RDI + 0x6c4c)),(char *)in_RSI);
      *(int *)(in_RDI + 0x6c4c) = local_14 + *(int *)(in_RDI + 0x6c4c);
      return;
    }
    if (31999 < *(int *)(in_RDI + 0x6c48)) break;
    *(int *)(in_RDI + 0x6c48) = *(int *)(in_RDI + 0x6c48) << 1;
    in_stack_ffffffffffffffe0 =
         (basic_string_view<char,_std::char_traits<char>_> *)
         operator_new__((long)*(int *)(in_RDI + 0x6c48));
    strncpy((char *)in_stack_ffffffffffffffe0,*(char **)(in_RDI + 0x6c40),
            (long)*(int *)(in_RDI + 0x6c4c));
    if (*(void **)(in_RDI + 0x6c40) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x6c40));
    }
    *(basic_string_view<char,_std::char_traits<char>_> **)(in_RDI + 0x6c40) =
         in_stack_ffffffffffffffe0;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  fmt._M_str = unaff_retaddr;
  fmt._M_len = in_RDI;
  CLogger::Warn<>(in_RSI,fmt);
  *(undefined4 *)(in_RDI + 0x6c4c) = 0;
  close_socket(in_stack_00001260);
  return;
}

Assistant:

void write_to_buffer(DESCRIPTOR_DATA *d, const char *txt, int length)
{
	/*
	 * Find length in case caller didn't.
	 */
	if (length <= 0)
		length = strlen(txt);

	/*
	 * Initial \n\r if needed.
	 */
	if (d->outtop == 0 && !d->fcommand)
	{
		d->outbuf[0] = '\n';
		d->outbuf[1] = '\r';
		d->outtop = 2;
	}

	/*
	 * Expand the buffer as needed.
	 */
	while (d->outtop + length >= d->outsize)
	{
		char *outbuf;

		if (d->outsize >= 32000)
		{
			RS.Logger.Warn("Buffer overflow. Closing.\n\r");
			d->outtop = 0;
			close_socket(d);
			return;
		}

		d->outsize *= 2;
		outbuf = new char[d->outsize];
		strncpy(outbuf, d->outbuf, d->outtop);
		delete[] d->outbuf;
		d->outbuf = outbuf;
	}

	/*
	 * Copy.
	 */
	strcpy(d->outbuf + d->outtop, txt);
	d->outtop += length;
}